

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

int __thiscall font2svg::glyph::init(glyph *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *this_00;
  FT_Face_conflict pFVar1;
  FT_GlyphSlot_conflict pFVar2;
  FT_Vector *pFVar3;
  short *psVar4;
  FT_Pos FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  FT_Pos FVar11;
  undefined4 uVar12;
  short sVar13;
  short sVar14;
  undefined4 uVar15;
  FT_Error FVar16;
  long lVar17;
  ostream *poVar18;
  size_t sVar19;
  long *extraout_RAX;
  long *plVar20;
  long lVar21;
  char glyph_name [1024];
  long *local_448;
  long local_440;
  long local_438 [2];
  char local_428 [1024];
  
  this->face = (this->file).face;
  lVar17 = strtol(*(char **)ctx,(char **)0x0,0);
  this->codepoint = (int)lVar17;
  uVar15 = FT_Get_Char_Index(this->face,(long)(int)lVar17);
  this_00 = &this->field_0xe8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"<!--\nUnicode requested: ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,*(char **)ctx,*(long *)(ctx + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," (decimal: ",0xb);
  poVar18 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->codepoint);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," hex: 0x",8);
  *(uint *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x18) =
       *(uint *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->codepoint);
  *(uint *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x18) =
       *(uint *)(poVar18 + *(long *)(*(long *)poVar18 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nGlyph index for unicode: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  FVar16 = FT_Load_Glyph(this->face,uVar15,1);
  this->error = FVar16;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nLoad Glyph into Face\'s glyph slot. error code: ",0x30);
  std::ostream::operator<<((ostream *)this_00,this->error);
  pFVar1 = this->face;
  pFVar2 = pFVar1->glyph;
  this->slot = pFVar2;
  uVar12 = *(undefined4 *)&(pFVar2->outline).field_0x24;
  (this->ftoutline).flags = (pFVar2->outline).flags;
  *(undefined4 *)&(this->ftoutline).field_0x24 = uVar12;
  sVar13 = (pFVar2->outline).n_contours;
  sVar14 = (pFVar2->outline).n_points;
  uVar12 = *(undefined4 *)&(pFVar2->outline).field_0x4;
  pFVar3 = (pFVar2->outline).points;
  psVar4 = (pFVar2->outline).contours;
  (this->ftoutline).tags = (pFVar2->outline).tags;
  (this->ftoutline).contours = psVar4;
  (this->ftoutline).n_contours = sVar13;
  (this->ftoutline).n_points = sVar14;
  *(undefined4 *)&(this->ftoutline).field_0x4 = uVar12;
  (this->ftoutline).points = pFVar3;
  FT_Get_Glyph_Name(pFVar1,uVar15,local_428,0x400);
  pFVar2 = this->slot;
  FVar5 = (pFVar2->metrics).height;
  FVar6 = (pFVar2->metrics).horiBearingX;
  FVar7 = (pFVar2->metrics).horiBearingY;
  FVar8 = (pFVar2->metrics).horiAdvance;
  FVar9 = (pFVar2->metrics).vertBearingX;
  FVar10 = (pFVar2->metrics).vertBearingY;
  FVar11 = (pFVar2->metrics).vertAdvance;
  (this->gm).width = (pFVar2->metrics).width;
  (this->gm).height = FVar5;
  (this->gm).horiBearingX = FVar6;
  (this->gm).horiBearingY = FVar7;
  (this->gm).horiAdvance = FVar8;
  (this->gm).vertBearingX = FVar9;
  (this->gm).vertBearingY = FVar10;
  (this->gm).vertAdvance = FVar11;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nGlyph Name: ",0xd);
  sVar19 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_428,sVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nGlyph Width: ",0xe);
  poVar18 = std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," Height: ",9);
  poVar18 = std::ostream::_M_insert<long>((long)poVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," Hor. Advance: ",0xf);
  poVar18 = std::ostream::_M_insert<long>((long)poVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," Vert. Advance: ",0x10);
  std::ostream::_M_insert<long>((long)poVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nNum points: ",0xd);
  std::ostream::operator<<((ostream *)this_00,(this->ftoutline).n_points);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nNum contours: ",0xf);
  std::ostream::operator<<((ostream *)this_00,(this->ftoutline).n_contours);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nContour endpoint index values:",0x1f);
  if (0 < (this->ftoutline).n_contours) {
    lVar17 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::operator<<((ostream *)this_00,(this->ftoutline).contours[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (this->ftoutline).n_contours);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n-->\n",5);
  pFVar3 = (this->ftoutline).points;
  this->ftpoints = pFVar3;
  lVar17 = (long)(this->ftoutline).n_points;
  if (0 < lVar17) {
    lVar21 = 0;
    do {
      plVar20 = (long *)((long)&pFVar3->y + lVar21);
      *plVar20 = -*plVar20;
      lVar21 = lVar21 + 0x10;
    } while (lVar17 * 0x10 != lVar21);
  }
  pFVar1 = this->face;
  lVar17 = (pFVar1->bbox).yMin;
  lVar21 = (pFVar1->bbox).yMax;
  this->bbwidth = (int)((pFVar1->bbox).xMax - (pFVar1->bbox).xMin);
  this->bbheight = (int)(lVar21 - lVar17);
  psVar4 = (this->ftoutline).contours;
  this->tags = (this->ftoutline).tags;
  this->contours = psVar4;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_448,local_440);
  plVar20 = local_438;
  if (local_448 != plVar20) {
    operator_delete(local_448,local_438[0] + 1);
    plVar20 = extraout_RAX;
  }
  return (int)plVar20;
}

Assistant:

void init( std::string unicode_s )
	{
		face = file.face;
		codepoint = strtol( unicode_s.c_str() , NULL, 0 );
		// Load the Glyph into the face's Glyph Slot + print details
		FT_UInt glyph_index = FT_Get_Char_Index( face, codepoint );
		debug << "<!--\nUnicode requested: " << unicode_s;
		debug << " (decimal: " << codepoint << " hex: 0x"
			<< std::hex << codepoint << std::dec << ")";
		debug << "\nGlyph index for unicode: " << glyph_index;
		error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
		debug << "\nLoad Glyph into Face's glyph slot. error code: " << error;
		slot = face->glyph;
		ftoutline = slot->outline;
		char glyph_name[1024];
		FT_Get_Glyph_Name( face, glyph_index, glyph_name, 1024 );
		gm = slot->metrics;
		debug << "\nGlyph Name: " << glyph_name;
		debug << "\nGlyph Width: " << gm.width
			<< " Height: " << gm.height
			<< " Hor. Advance: " << gm.horiAdvance
			<< " Vert. Advance: " << gm.vertAdvance;

		// Print outline details, taken from the glyph in the slot.
		debug << "\nNum points: " << ftoutline.n_points;
		debug << "\nNum contours: " << ftoutline.n_contours;
		debug << "\nContour endpoint index values:";
		for ( int i = 0 ; i < ftoutline.n_contours ; i++ ) debug << " " << ftoutline.contours[i];
		debug << "\n-->\n";

		// Invert y coordinates (SVG = neg at top, TType = neg at bottom)
		ftpoints = ftoutline.points;
		for ( int i = 0 ; i < ftoutline.n_points ; i++ )
			ftpoints[i].y *= -1;

		bbheight = face->bbox.yMax - face->bbox.yMin;
		bbwidth = face->bbox.xMax - face->bbox.xMin;
		tags = ftoutline.tags;
		contours = ftoutline.contours;
		std::cout << debug.str();
	}